

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall ccs::ParserImpl::advance(ParserImpl *this)

{
  double dVar1;
  uint32_t uVar2;
  Token tmp;
  undefined1 local_c8 [48];
  vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> local_98;
  int64_t local_80;
  double dStack_78;
  Token local_70;
  
  (this->last_).location.column = (this->cur_).location.column;
  uVar2 = (this->cur_).location.line;
  (this->last_).type = (this->cur_).type;
  (this->last_).location.line = uVar2;
  std::__cxx11::string::_M_assign((string *)&(this->last_).value);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::operator=
            (&(this->last_).stringValue.elements_,&(this->cur_).stringValue.elements_);
  dVar1 = (this->cur_).doubleValue;
  (this->last_).intValue = (this->cur_).intValue;
  (this->last_).doubleValue = dVar1;
  local_c8._8_4_ = (this->lex_).next_.location.column;
  local_c8._0_4_ = (this->lex_).next_.type;
  local_c8._4_4_ = (this->lex_).next_.location.line;
  std::__cxx11::string::string((string *)(local_c8 + 0x10),(string *)&(this->lex_).next_.value);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::vector
            (&local_98,&(this->lex_).next_.stringValue.elements_);
  local_80 = (this->lex_).next_.intValue;
  dStack_78 = (this->lex_).next_.doubleValue;
  anon_unknown_0::Lexer::nextToken(&local_70,&this->lex_);
  anon_unknown_0::Token::operator=(&(this->lex_).next_,&local_70);
  anon_unknown_0::Token::~Token(&local_70);
  anon_unknown_0::Token::operator=(&this->cur_,(Token *)local_c8);
  anon_unknown_0::Token::~Token((Token *)local_c8);
  return;
}

Assistant:

void advance() { last_ = cur_; cur_ = lex_.consume(); }